

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactNSC.h
# Opt level: O1

void __thiscall
chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>::
ConstraintsBiLoad_C(ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>
                    *this,double factor,double recovery_clamp,bool do_clamp)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ChContactable_3vars<6,_6,_6> *pCVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  double dVar11;
  undefined1 in_register_00001208 [56];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar18 [64];
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  Vector V2_w;
  Vector V1_w;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  
  auVar18._8_56_ = in_register_00001248;
  auVar18._0_8_ = recovery_clamp;
  auVar13._8_56_ = in_register_00001208;
  auVar13._0_8_ = factor;
  auVar10 = auVar13._0_16_;
  pCVar4 = (this->
           super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>
           ).objA;
  if (((pCVar4 != (ChContactable_3vars<6,_6,_6> *)0x0) &&
      ((this->
       super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>
       ).objB != (ChContactable_3vars<6,_6,_6> *)0x0)) &&
     ((this->restitution != 0.0 || (NAN(this->restitution))))) {
    (*(pCVar4->super_ChContactable)._vptr_ChContactable[10])
              (&local_38,pCVar4,
               &(this->
                super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>
                ).p1);
    pCVar4 = (this->
             super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>
             ).objB;
    (*(pCVar4->super_ChContactable)._vptr_ChContactable[10])
              (&local_50,pCVar4,
               &(this->
                super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>
                ).p2);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = factor;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (this->
                   super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>
                   ).contact_plane.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0];
    auVar14._8_8_ = 0;
    auVar14._0_8_ =
         (local_48 - local_30) *
         (this->
         super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>
         ).contact_plane.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar22._8_8_ = 0;
    auVar22._0_8_ = local_50 - local_38;
    auVar9 = vfmadd231sd_fma(auVar14,auVar22,auVar9);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (this->
                   super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>
                   ).contact_plane.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[6];
    auVar20._8_8_ = 0;
    auVar20._0_8_ = local_40 - local_28;
    auVar9 = vfmadd231sd_fma(auVar9,auVar20,auVar1);
    dVar11 = auVar9._0_8_ * this->restitution;
    auVar15._8_8_ = 0;
    auVar15._0_8_ =
         ((((this->
            super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>
            ).container)->super_ChPhysicsItem).system)->min_bounce_speed;
    auVar6._8_8_ = 0x8000000000000000;
    auVar6._0_8_ = 0x8000000000000000;
    auVar9 = vxorpd_avx512vl(auVar15,auVar6);
    if ((dVar11 < auVar9._0_8_) &&
       (auVar16._0_8_ = 1.0 / factor, auVar16._8_8_ = 0, auVar2._8_8_ = 0,
       auVar2._0_8_ = (this->
                      super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>
                      ).norm_dist, auVar23._8_8_ = 0, auVar23._0_8_ = dVar11,
       auVar9 = vfmadd213sd_fma(auVar16,auVar23,auVar2), auVar9._0_8_ < 0.0)) {
      dVar11 = dVar11 + (this->Nx).
                        super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<6,_6,_6>_>
                        .super_ChConstraint.b_i;
      goto LAB_0056ca90;
    }
  }
  dVar11 = this->compliance;
  if ((dVar11 != 0.0) || (NAN(dVar11))) {
    dVar19 = 1.0 / auVar10._0_8_;
    dVar5 = dVar19 + this->dampingf;
    dVar19 = 1.0 / (dVar19 * dVar5);
    (this->Nx).
    super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<6,_6,_6>_>
    .super_ChConstraint.cfm_i = dVar11 * dVar19;
    dVar19 = dVar19 * this->complianceT;
    (this->Tu).
    super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<6,_6,_6>_>
    .super_ChConstraint.cfm_i = dVar19;
    (this->Tv).
    super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<6,_6,_6>_>
    .super_ChConstraint.cfm_i = dVar19;
    dVar11 = (1.0 / dVar5) *
             (this->
             super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>
             ).norm_dist;
    auVar7._8_8_ = 0x8000000000000000;
    auVar7._0_8_ = 0x8000000000000000;
    auVar10 = vxorpd_avx512vl(auVar18._0_16_,auVar7);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar11;
    auVar10 = vmaxsd_avx(auVar12,auVar10);
    dVar11 = (double)((ulong)do_clamp * auVar10._0_8_ + (ulong)!do_clamp * (long)dVar11) +
             (this->Nx).
             super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<6,_6,_6>_>
             .super_ChConstraint.b_i;
  }
  else {
    if (!do_clamp) {
      auVar17._8_8_ = 0;
      auVar17._0_8_ =
           (this->
           super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>
           ).norm_dist;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (this->Nx).
                     super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<6,_6,_6>_>
                     .super_ChConstraint.b_i;
      auVar10 = vfmadd213sd_fma(auVar17,auVar10,auVar3);
      (this->Nx).
      super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<6,_6,_6>_>
      .super_ChConstraint.b_i = auVar10._0_8_;
      return;
    }
    dVar5 = (this->Nx).super_ChConstraintTwoTuplesContactNall.cohesion;
    dVar11 = (this->Nx).
             super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<6,_6,_6>_>
             .super_ChConstraint.b_i;
    auVar8._8_8_ = 0x8000000000000000;
    auVar8._0_8_ = 0x8000000000000000;
    auVar9 = vxorpd_avx512vl(auVar18._0_16_,auVar8);
    auVar21._8_8_ = 0;
    auVar21._0_8_ =
         auVar10._0_8_ *
         (this->
         super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>
         ).norm_dist;
    auVar10 = vmaxsd_avx(auVar21,auVar9);
    if ((dVar5 != 0.0) || (NAN(dVar5))) {
      auVar10 = vminsd_avx(ZEXT816(0) << 0x40,auVar10);
      dVar11 = dVar11 + auVar10._0_8_;
    }
    else {
      dVar11 = dVar11 + auVar10._0_8_;
    }
  }
LAB_0056ca90:
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_3vars<6,_6,_6>_>
  .super_ChConstraint.b_i = dVar11;
  return;
}

Assistant:

virtual void ConstraintsBiLoad_C(double factor = 1., double recovery_clamp = 0.1, bool do_clamp = false) override {
        bool bounced = false;

        // Elastic Restitution model (use simple Newton model with coefficient e=v(+)/v(-))
        // Note that this works only if the two connected items are two ChBody.

        if (this->objA && this->objB) {
            if (this->restitution) {
                // compute normal rebounce speed
                Vector V1_w = this->objA->GetContactPointSpeed(this->p1);
                Vector V2_w = this->objB->GetContactPointSpeed(this->p2);
                Vector Vrel_w = V2_w - V1_w;
                Vector Vrel_cplane = this->contact_plane.transpose() * Vrel_w;

                double h = 1.0 / factor;  // inverse timestep is factor

                double neg_rebounce_speed = Vrel_cplane.x() * this->restitution;
                if (neg_rebounce_speed < -this->container->GetSystem()->GetMinBounceSpeed())
                    if (this->norm_dist + neg_rebounce_speed * h < 0) {
                        // CASE: BOUNCE
                        bounced = true;
                        Nx.Set_b_i(Nx.Get_b_i() + neg_rebounce_speed);
                    }
            }
        }

        if (!bounced) {
            // CASE: SETTLE (most often, and also default if two colliding items are not two ChBody)

            if (this->compliance) {
                //  inverse timestep is factor
                double h = 1.0 / factor;

                double alpha = this->dampingf;              // [R]=alpha*[K]
                double inv_hpa = 1.0 / (h + alpha);         // 1/(h+a)
                double inv_hhpa = 1.0 / (h * (h + alpha));  // 1/(h*(h+a))

                Nx.Set_cfm_i((inv_hhpa) * this->compliance);  // was (inv_hh)* ...   //***TEST DAMPING***//
                Tu.Set_cfm_i((inv_hhpa) * this->complianceT);
                Tv.Set_cfm_i((inv_hhpa) * this->complianceT);

				double qc = inv_hpa * this->norm_dist;

				// If clamping kicks in(when using large timesteps and low compliance), it acts as a numerical damping.
				if (do_clamp)
					qc = ChMax(qc, -recovery_clamp);

                Nx.Set_b_i(Nx.Get_b_i() + qc); 

            } else {
                // GetLog()<< "rigid " << (int)this << "  recov_clamp=" << recovery_clamp << "\n";
                if (do_clamp)
                    if (this->Nx.GetCohesion())
                        Nx.Set_b_i(Nx.Get_b_i() + ChMin(0.0, ChMax(factor * this->norm_dist, -recovery_clamp)));
                    else
                        Nx.Set_b_i(Nx.Get_b_i() + ChMax(factor * this->norm_dist, -recovery_clamp));
                else
                    Nx.Set_b_i(Nx.Get_b_i() + factor * this->norm_dist);
            }
        }
    }